

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

GCstr * lj_str_alloc(lua_State *L,char *str,MSize len,StrHash hash,int hashalg)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  GCstr *pGVar8;
  uint64_t uVar9;
  
  pGVar8 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)((len & 0xfffffffc) + 4) + 0x18);
  uVar5 = (L->glref).ptr64;
  pGVar8->marked = *(byte *)(uVar5 + 0x20) & 3;
  pGVar8->gct = '\x04';
  pGVar8->len = len;
  pGVar8->hash = hash;
  pcVar1 = (char *)(uVar5 + 0xac);
  cVar2 = *pcVar1;
  *pcVar1 = *pcVar1 + -1;
  if (cVar2 == '\0') {
    uVar9 = lj_prng_u64((PRNGState *)(uVar5 + 0x188));
    *(char *)(uVar5 + 0xac) = (char)(uVar9 >> 0x38);
  }
  else {
    uVar9 = (uint64_t)*(uint *)(uVar5 + 0xa8);
  }
  *(StrID *)(uVar5 + 0xa8) = (StrID)uVar9 + 1;
  pGVar8->sid = (StrID)uVar9;
  pGVar8->reserved = '\0';
  pGVar8->hashalg = (uint8_t)hashalg;
  *(undefined4 *)((long)&pGVar8[1].nextgc.gcptr64 + (ulong)(len & 0xfffffffc)) = 0;
  memcpy(pGVar8 + 1,str,(ulong)len);
  uVar3 = *(uint *)(uVar5 + 0xa0);
  lVar6 = *(long *)(uVar5 + 0x98);
  uVar7 = *(ulong *)(lVar6 + (ulong)(hash & uVar3) * 8);
  (pGVar8->nextgc).gcptr64 = uVar7 & 0xfffffffffffffffe;
  *(ulong *)(lVar6 + (ulong)(hash & uVar3) * 8) = (ulong)((uint)uVar7 & 1) | (ulong)pGVar8;
  uVar4 = *(uint *)(uVar5 + 0xa4);
  *(uint *)(uVar5 + 0xa4) = uVar4 + 1;
  if (uVar3 < uVar4) {
    lj_str_resize(L,uVar3 * 2 + 1);
  }
  return pGVar8;
}

Assistant:

static GCstr *lj_str_alloc(lua_State *L, const char *str, MSize len,
			   StrHash hash, int hashalg)
{
  GCstr *s = lj_mem_newt(L, lj_str_size(len), GCstr);
  global_State *g = G(L);
  uintptr_t u;
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = hash;
#ifndef STRID_RESEED_INTERVAL
  s->sid = g->str.id++;
#elif STRID_RESEED_INTERVAL
  if (!g->str.idreseed--) {
    uint64_t r = lj_prng_u64(&g->prng);
    g->str.id = (StrID)r;
    g->str.idreseed = (uint8_t)(r >> (64 - STRID_RESEED_INTERVAL));
  }
  s->sid = g->str.id++;
#else
  s->sid = (StrID)lj_prng_u64(&g->prng);
#endif
  s->reserved = 0;
  s->hashalg = (uint8_t)hashalg;
  /* Clear last 4 bytes of allocated memory. Implies zero-termination, too. */
  *(uint32_t *)(strdatawr(s)+(len & ~(MSize)3)) = 0;
  memcpy(strdatawr(s), str, len);
  /* Add to string hash table. */
  hash &= g->str.mask;
  u = gcrefu(g->str.tab[hash]);
  setgcrefp(s->nextgc, (u & ~(uintptr_t)1));
  /* NOBARRIER: The string table is a GC root. */
  setgcrefp(g->str.tab[hash], ((uintptr_t)s | (u & 1)));
  if (g->str.num++ > g->str.mask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->str.mask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}